

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  BBox1f BVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar35) [16];
  RayHitK<8> *pRVar36;
  int iVar37;
  uint uVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar80;
  float fVar81;
  vint4 ai;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar82;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar83;
  float fVar91;
  float fVar92;
  vint4 ai_4;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar98;
  vint4 bi;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  vint4 ai_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  vint4 bi_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined4 uVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar152;
  float fVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar150 [32];
  float fVar154;
  undefined1 auVar151 [32];
  float fVar159;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  vint4 bi_2;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  vint<8> itime;
  vfloat<8> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_16a1;
  ulong local_16a0;
  uint local_1698;
  uint local_1694;
  long local_1690;
  ulong local_1688;
  undefined1 local_1680 [32];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [16];
  long local_1630;
  long local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong local_1600;
  RayHitK<8> *local_15f8;
  ulong local_15f0;
  undefined1 (*local_15e8) [16];
  long local_15e0;
  long local_15d8;
  Scene *local_15d0;
  ulong local_15c8;
  undefined1 local_15c0 [32];
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  float local_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 local_14a0 [32];
  undefined8 local_1480;
  uint uStack_1478;
  uint uStack_1474;
  uint uStack_1470;
  uint uStack_146c;
  uint uStack_1468;
  uint uStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 *local_1380;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [8];
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar39 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar124 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1500._4_4_ = uVar124;
  local_1500._0_4_ = uVar124;
  local_1500._8_4_ = uVar124;
  local_1500._12_4_ = uVar124;
  auVar130 = ZEXT1664(local_1500);
  uVar124 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1510._4_4_ = uVar124;
  local_1510._0_4_ = uVar124;
  local_1510._8_4_ = uVar124;
  local_1510._12_4_ = uVar124;
  auVar137 = ZEXT1664(local_1510);
  uVar124 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1640._4_4_ = uVar124;
  local_1640._0_4_ = uVar124;
  local_1640._8_4_ = uVar124;
  local_1640._12_4_ = uVar124;
  auVar123 = ZEXT1664(local_1640);
  fStack_14b4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_14c4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_14d4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fStack_1514 = fStack_14b4 * 0.99999964;
  fStack_1524 = fStack_14c4 * 0.99999964;
  fStack_14a4 = fStack_14d4 * 0.99999964;
  fStack_14b4 = fStack_14b4 * 1.0000004;
  fStack_14c4 = fStack_14c4 * 1.0000004;
  fStack_14d4 = fStack_14d4 * 1.0000004;
  local_1600 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1608 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1610 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1618 = local_1600 ^ 0x10;
  local_1620 = local_1608 ^ 0x10;
  uVar48 = local_1610 ^ 0x10;
  iVar37 = (tray->tnear).field_0.i[k];
  local_14f0._4_4_ = iVar37;
  local_14f0._0_4_ = iVar37;
  local_14f0._8_4_ = iVar37;
  local_14f0._12_4_ = iVar37;
  auVar189 = ZEXT1664(local_14f0);
  iVar37 = (tray->tfar).field_0.i[k];
  auVar192 = ZEXT1664(CONCAT412(iVar37,CONCAT48(iVar37,CONCAT44(iVar37,iVar37))));
  local_1260._16_16_ = mm_lookupmask_ps._240_16_;
  local_1260._0_16_ = mm_lookupmask_ps._0_16_;
  iVar37 = 1 << ((uint)k & 0x1f);
  auVar61._4_4_ = iVar37;
  auVar61._0_4_ = iVar37;
  auVar61._8_4_ = iVar37;
  auVar61._12_4_ = iVar37;
  auVar61._16_4_ = iVar37;
  auVar61._20_4_ = iVar37;
  auVar61._24_4_ = iVar37;
  auVar61._28_4_ = iVar37;
  auVar62 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar61 = vpand_avx2(auVar61,auVar62);
  local_1240 = vpcmpeqd_avx2(auVar61,auVar62);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar72._16_4_ = 0x3f800000;
  auVar72._20_4_ = 0x3f800000;
  auVar72._24_4_ = 0x3f800000;
  auVar72._28_4_ = 0x3f800000;
  auVar62._8_4_ = 0xbf800000;
  auVar62._0_8_ = 0xbf800000bf800000;
  auVar62._12_4_ = 0xbf800000;
  auVar62._16_4_ = 0xbf800000;
  auVar62._20_4_ = 0xbf800000;
  auVar62._24_4_ = 0xbf800000;
  auVar62._28_4_ = 0xbf800000;
  _local_1280 = vblendvps_avx(auVar72,auVar62,local_1260);
  fStack_14a8 = fStack_14a4;
  fStack_14ac = fStack_14a4;
  local_14b0 = fStack_14a4;
  fStack_14b8 = fStack_14b4;
  fStack_14bc = fStack_14b4;
  local_14c0 = fStack_14b4;
  fStack_14c8 = fStack_14c4;
  fStack_14cc = fStack_14c4;
  local_14d0 = fStack_14c4;
  fStack_14d8 = fStack_14d4;
  fStack_14dc = fStack_14d4;
  local_14e0 = fStack_14d4;
  fStack_1518 = fStack_1514;
  fStack_151c = fStack_1514;
  local_1520 = fStack_1514;
  fStack_1528 = fStack_1524;
  fStack_152c = fStack_1524;
  local_1530 = fStack_1524;
  local_15f8 = ray;
  local_16a0 = uVar48;
  fVar154 = fStack_14d4;
  fVar153 = fStack_14d4;
  fVar152 = fStack_14d4;
  fVar147 = fStack_14d4;
  fVar82 = fStack_14c4;
  fVar81 = fStack_14c4;
  fVar174 = fStack_14c4;
  fVar167 = fStack_14c4;
  fVar164 = fStack_14b4;
  fVar163 = fStack_14b4;
  fVar162 = fStack_14b4;
  fVar159 = fStack_14b4;
  fVar155 = fStack_14a4;
  fVar96 = fStack_14a4;
  fVar98 = fStack_14a4;
  fVar95 = fStack_14a4;
  fVar94 = fStack_1524;
  fVar93 = fStack_1524;
  fVar92 = fStack_1524;
  fVar91 = fStack_1524;
  fVar80 = fStack_1514;
  fVar68 = fStack_1514;
  fVar83 = fStack_1514;
  fVar97 = fStack_1514;
  uVar53 = local_1620;
  uVar50 = local_1610;
  uVar49 = local_1608;
  uVar47 = local_1600;
  uVar45 = local_1618;
LAB_0059d300:
  do {
    pauVar35 = pauVar39 + -1;
    pauVar39 = pauVar39 + -1;
    if (*(float *)(*pauVar35 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      local_1410 = auVar192._0_16_;
      uVar54 = *(ulong *)*pauVar39;
      while ((uVar54 & 8) == 0) {
        uVar40 = uVar54 & 0xfffffffffffffff0;
        uVar124 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar55._4_4_ = uVar124;
        auVar55._0_4_ = uVar124;
        auVar55._8_4_ = uVar124;
        auVar55._12_4_ = uVar124;
        auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x80 + uVar47),auVar55,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + uVar47));
        auVar57 = vsubps_avx(auVar57,auVar130._0_16_);
        auVar56._0_4_ = fVar97 * auVar57._0_4_;
        auVar56._4_4_ = fVar83 * auVar57._4_4_;
        auVar56._8_4_ = fVar68 * auVar57._8_4_;
        auVar56._12_4_ = fVar80 * auVar57._12_4_;
        auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x80 + uVar49),auVar55,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + uVar49));
        auVar57 = vsubps_avx(auVar57,auVar137._0_16_);
        auVar84._0_4_ = fVar91 * auVar57._0_4_;
        auVar84._4_4_ = fVar92 * auVar57._4_4_;
        auVar84._8_4_ = fVar93 * auVar57._8_4_;
        auVar84._12_4_ = fVar94 * auVar57._12_4_;
        auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x80 + uVar50),auVar55,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + uVar50));
        auVar57 = vsubps_avx(auVar57,auVar123._0_16_);
        auVar99._0_4_ = fVar95 * auVar57._0_4_;
        auVar99._4_4_ = fVar98 * auVar57._4_4_;
        auVar99._8_4_ = fVar96 * auVar57._8_4_;
        auVar99._12_4_ = fVar155 * auVar57._12_4_;
        auVar57 = vmaxps_avx(auVar84,auVar99);
        auVar56 = vmaxps_avx(auVar189._0_16_,auVar56);
        auVar57 = vmaxps_avx(auVar56,auVar57);
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x80 + uVar45),auVar55,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + uVar45));
        auVar56 = vsubps_avx(auVar56,auVar130._0_16_);
        auVar85._0_4_ = fVar159 * auVar56._0_4_;
        auVar85._4_4_ = fVar162 * auVar56._4_4_;
        auVar85._8_4_ = fVar163 * auVar56._8_4_;
        auVar85._12_4_ = fVar164 * auVar56._12_4_;
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x80 + uVar53),auVar55,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + uVar53));
        auVar56 = vsubps_avx(auVar56,auVar137._0_16_);
        auVar84 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x80 + uVar48),auVar55,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + uVar48));
        auVar100._0_4_ = fVar167 * auVar56._0_4_;
        auVar100._4_4_ = fVar174 * auVar56._4_4_;
        auVar100._8_4_ = fVar81 * auVar56._8_4_;
        auVar100._12_4_ = fVar82 * auVar56._12_4_;
        auVar56 = vsubps_avx(auVar84,auVar123._0_16_);
        auVar105._0_4_ = fVar147 * auVar56._0_4_;
        auVar105._4_4_ = fVar152 * auVar56._4_4_;
        auVar105._8_4_ = fVar153 * auVar56._8_4_;
        auVar105._12_4_ = fVar154 * auVar56._12_4_;
        auVar56 = vminps_avx(auVar100,auVar105);
        auVar84 = vminps_avx(local_1410,auVar85);
        auVar56 = vminps_avx(auVar84,auVar56);
        if (((uint)uVar54 & 7) == 6) {
          auVar84 = vcmpps_avx(auVar57,auVar56,2);
          auVar56 = vcmpps_avx(*(undefined1 (*) [16])(uVar40 + 0xe0),auVar55,2);
          auVar55 = vcmpps_avx(auVar55,*(undefined1 (*) [16])(uVar40 + 0xf0),1);
          auVar56 = vandps_avx(auVar56,auVar55);
          auVar56 = vandps_avx(auVar56,auVar84);
        }
        else {
          auVar56 = vcmpps_avx(auVar57,auVar56,2);
        }
        auVar56 = vpslld_avx(auVar56,0x1f);
        uVar42 = vmovmskps_avx(auVar56);
        local_13e0._0_16_ = auVar57;
        if (uVar42 == 0) {
          if (pauVar39 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0059d300;
        }
        uVar42 = uVar42 & 0xff;
        lVar15 = 0;
        for (uVar54 = (ulong)uVar42; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar54 = *(ulong *)(uVar40 + lVar15 * 8);
        uVar42 = uVar42 - 1 & uVar42;
        uVar43 = (ulong)uVar42;
        if (uVar42 != 0) {
          uVar38 = *(uint *)(local_13e0 + lVar15 * 4);
          lVar15 = 0;
          for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          uVar42 = uVar42 - 1 & uVar42;
          uVar46 = (ulong)uVar42;
          uVar43 = *(ulong *)(uVar40 + lVar15 * 8);
          uVar5 = *(uint *)(local_13e0 + lVar15 * 4);
          uVar48 = local_16a0;
          if (uVar42 == 0) {
            if (uVar38 < uVar5) {
              *(ulong *)*pauVar39 = uVar43;
              *(uint *)(*pauVar39 + 8) = uVar5;
              pauVar39 = pauVar39 + 1;
            }
            else {
              *(ulong *)*pauVar39 = uVar54;
              *(uint *)(*pauVar39 + 8) = uVar38;
              pauVar39 = pauVar39 + 1;
              uVar54 = uVar43;
            }
          }
          else {
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar54;
            auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar38));
            auVar69._8_8_ = 0;
            auVar69._0_8_ = uVar43;
            auVar56 = vpunpcklqdq_avx(auVar69,ZEXT416(uVar5));
            lVar15 = 0;
            for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar42 = uVar42 - 1 & uVar42;
            uVar54 = (ulong)uVar42;
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(uVar40 + lVar15 * 8);
            auVar55 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_13e0 + lVar15 * 4)));
            auVar84 = vpcmpgtd_avx(auVar56,auVar57);
            if (uVar42 == 0) {
              auVar85 = vpshufd_avx(auVar84,0xaa);
              auVar84 = vblendvps_avx(auVar56,auVar57,auVar85);
              auVar57 = vblendvps_avx(auVar57,auVar56,auVar85);
              auVar56 = vpcmpgtd_avx(auVar55,auVar84);
              auVar85 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar55,auVar84,auVar85);
              auVar84 = vblendvps_avx(auVar84,auVar55,auVar85);
              auVar55 = vpcmpgtd_avx(auVar84,auVar57);
              auVar85 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar84,auVar57,auVar85);
              auVar57 = vblendvps_avx(auVar57,auVar84,auVar85);
              *pauVar39 = auVar57;
              pauVar39[1] = auVar55;
              uVar54 = auVar56._0_8_;
              pauVar39 = pauVar39 + 2;
            }
            else {
              lVar15 = 0;
              for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              auVar106._8_8_ = 0;
              auVar106._0_8_ = *(ulong *)(uVar40 + lVar15 * 8);
              auVar99 = vpunpcklqdq_avx(auVar106,ZEXT416(*(uint *)(local_13e0 + lVar15 * 4)));
              auVar85 = vpshufd_avx(auVar84,0xaa);
              auVar84 = vblendvps_avx(auVar56,auVar57,auVar85);
              auVar57 = vblendvps_avx(auVar57,auVar56,auVar85);
              auVar56 = vpcmpgtd_avx(auVar99,auVar55);
              auVar85 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar99,auVar55,auVar85);
              auVar55 = vblendvps_avx(auVar55,auVar99,auVar85);
              auVar85 = vpcmpgtd_avx(auVar55,auVar57);
              auVar99 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar55,auVar57,auVar99);
              auVar57 = vblendvps_avx(auVar57,auVar55,auVar99);
              auVar55 = vpcmpgtd_avx(auVar56,auVar84);
              auVar99 = vpshufd_avx(auVar55,0xaa);
              auVar55 = vblendvps_avx(auVar56,auVar84,auVar99);
              auVar56 = vblendvps_avx(auVar84,auVar56,auVar99);
              auVar84 = vpcmpgtd_avx(auVar85,auVar56);
              auVar99 = vpshufd_avx(auVar84,0xaa);
              auVar84 = vblendvps_avx(auVar85,auVar56,auVar99);
              auVar56 = vblendvps_avx(auVar56,auVar85,auVar99);
              *pauVar39 = auVar57;
              pauVar39[1] = auVar56;
              pauVar39[2] = auVar84;
              auVar123 = ZEXT1664(local_1640);
              uVar54 = auVar55._0_8_;
              pauVar39 = pauVar39 + 3;
            }
          }
        }
      }
      local_1630 = (ulong)((uint)uVar54 & 0xf) - 8;
      if (local_1630 != 0) {
        uVar54 = uVar54 & 0xfffffffffffffff0;
        local_1628 = 0;
        local_15f0 = uVar54;
        local_15e8 = pauVar39;
        do {
          local_1690 = local_1628 * 0x90;
          uVar40 = *(ulong *)(uVar54 + 0x20 + local_1690);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar40;
          auVar57 = vpmovzxbd_avx(auVar58);
          auVar57 = vcvtdq2ps_avx(auVar57);
          uVar124 = *(undefined4 *)(uVar54 + 0x44 + local_1690);
          auVar125._4_4_ = uVar124;
          auVar125._0_4_ = uVar124;
          auVar125._8_4_ = uVar124;
          auVar125._12_4_ = uVar124;
          uVar124 = *(undefined4 *)(uVar54 + 0x38 + local_1690);
          auVar131._4_4_ = uVar124;
          auVar131._0_4_ = uVar124;
          auVar131._8_4_ = uVar124;
          auVar131._12_4_ = uVar124;
          auVar84 = vfmadd213ps_fma(auVar57,auVar125,auVar131);
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(uVar54 + 0x50 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar107);
          auVar57 = vcvtdq2ps_avx(auVar57);
          uVar124 = *(undefined4 *)(uVar54 + 0x74 + local_1690);
          auVar138._4_4_ = uVar124;
          auVar138._0_4_ = uVar124;
          auVar138._8_4_ = uVar124;
          auVar138._12_4_ = uVar124;
          uVar124 = *(undefined4 *)(uVar54 + 0x68 + local_1690);
          auVar142._4_4_ = uVar124;
          auVar142._0_4_ = uVar124;
          auVar142._8_4_ = uVar124;
          auVar142._12_4_ = uVar124;
          auVar55 = vfmadd213ps_fma(auVar57,auVar138,auVar142);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(uVar54 + 0x24 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar70);
          auVar57 = vcvtdq2ps_avx(auVar57);
          auVar85 = vfmadd213ps_fma(auVar57,auVar125,auVar131);
          auVar126._8_8_ = 0;
          auVar126._0_8_ = *(ulong *)(uVar54 + 0x54 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar126);
          auVar57 = vcvtdq2ps_avx(auVar57);
          auVar99 = vfmadd213ps_fma(auVar57,auVar138,auVar142);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = *(ulong *)(uVar54 + 0x28 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar132);
          auVar57 = vcvtdq2ps_avx(auVar57);
          uVar124 = *(undefined4 *)(uVar54 + 0x48 + local_1690);
          auVar148._4_4_ = uVar124;
          auVar148._0_4_ = uVar124;
          auVar148._8_4_ = uVar124;
          auVar148._12_4_ = uVar124;
          uVar124 = *(undefined4 *)(uVar54 + 0x3c + local_1690);
          auVar160._4_4_ = uVar124;
          auVar160._0_4_ = uVar124;
          auVar160._8_4_ = uVar124;
          auVar160._12_4_ = uVar124;
          auVar100 = vfmadd213ps_fma(auVar57,auVar148,auVar160);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)(uVar54 + 0x58 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar139);
          auVar57 = vcvtdq2ps_avx(auVar57);
          uVar124 = *(undefined4 *)(uVar54 + 0x78 + local_1690);
          auVar168._4_4_ = uVar124;
          auVar168._0_4_ = uVar124;
          auVar168._8_4_ = uVar124;
          auVar168._12_4_ = uVar124;
          uVar124 = *(undefined4 *)(uVar54 + 0x6c + local_1690);
          auVar185._4_4_ = uVar124;
          auVar185._0_4_ = uVar124;
          auVar185._8_4_ = uVar124;
          auVar185._12_4_ = uVar124;
          auVar105 = vfmadd213ps_fma(auVar57,auVar168,auVar185);
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)(uVar54 + 0x2c + local_1690);
          auVar57 = vpmovzxbd_avx(auVar143);
          auVar57 = vcvtdq2ps_avx(auVar57);
          auVar69 = vfmadd213ps_fma(auVar57,auVar148,auVar160);
          auVar149._8_8_ = 0;
          auVar149._0_8_ = *(ulong *)(uVar54 + 0x5c + local_1690);
          auVar57 = vpmovzxbd_avx(auVar149);
          auVar57 = vcvtdq2ps_avx(auVar57);
          auVar86 = vfmadd213ps_fma(auVar57,auVar168,auVar185);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = *(ulong *)(uVar54 + 0x30 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar161);
          auVar57 = vcvtdq2ps_avx(auVar57);
          uVar124 = *(undefined4 *)(uVar54 + 0x4c + local_1690);
          auVar169._4_4_ = uVar124;
          auVar169._0_4_ = uVar124;
          auVar169._8_4_ = uVar124;
          auVar169._12_4_ = uVar124;
          uVar124 = *(undefined4 *)(uVar54 + 0x40 + local_1690);
          auVar186._4_4_ = uVar124;
          auVar186._0_4_ = uVar124;
          auVar186._8_4_ = uVar124;
          auVar186._12_4_ = uVar124;
          auVar106 = vfmadd213ps_fma(auVar57,auVar169,auVar186);
          auVar188._8_8_ = 0;
          auVar188._0_8_ = *(ulong *)(uVar54 + 0x60 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar188);
          auVar57 = vcvtdq2ps_avx(auVar57);
          auVar190._8_8_ = 0;
          auVar190._0_8_ = *(ulong *)(uVar54 + 0x34 + local_1690);
          auVar56 = vpmovzxbd_avx(auVar190);
          auVar56 = vcvtdq2ps_avx(auVar56);
          auVar56 = vfmadd213ps_fma(auVar56,auVar169,auVar186);
          uVar124 = *(undefined4 *)(uVar54 + 0x7c + local_1690);
          auVar170._4_4_ = uVar124;
          auVar170._0_4_ = uVar124;
          auVar170._8_4_ = uVar124;
          auVar170._12_4_ = uVar124;
          uVar124 = *(undefined4 *)(uVar54 + 0x70 + local_1690);
          auVar187._4_4_ = uVar124;
          auVar187._0_4_ = uVar124;
          auVar187._8_4_ = uVar124;
          auVar187._12_4_ = uVar124;
          auVar59 = vfmadd213ps_fma(auVar57,auVar170,auVar187);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)(uVar54 + 100 + local_1690);
          auVar57 = vpmovzxbd_avx(auVar87);
          auVar57 = vcvtdq2ps_avx(auVar57);
          auVar71 = vfmadd213ps_fma(auVar57,auVar170,auVar187);
          fVar97 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar54 + 0x80 + local_1690)) *
                   *(float *)(uVar54 + 0x84 + local_1690);
          auVar171._4_4_ = fVar97;
          auVar171._0_4_ = fVar97;
          auVar171._8_4_ = fVar97;
          auVar171._12_4_ = fVar97;
          auVar57 = vsubps_avx(auVar55,auVar84);
          auVar84 = vfmadd213ps_fma(auVar57,auVar171,auVar84);
          auVar57 = vsubps_avx(auVar99,auVar85);
          auVar55 = vfmadd213ps_fma(auVar57,auVar171,auVar85);
          auVar57 = vsubps_avx(auVar105,auVar100);
          auVar85 = vfmadd213ps_fma(auVar57,auVar171,auVar100);
          auVar57 = vsubps_avx(auVar86,auVar69);
          auVar99 = vfmadd213ps_fma(auVar57,auVar171,auVar69);
          auVar57 = vsubps_avx(auVar59,auVar106);
          auVar189 = ZEXT1664(local_14f0);
          auVar100 = vfmadd213ps_fma(auVar57,auVar171,auVar106);
          auVar57 = vsubps_avx(auVar71,auVar56);
          auVar105 = vfmadd213ps_fma(auVar57,auVar171,auVar56);
          auVar57 = vpminub_avx(auVar58,auVar70);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar40;
          auVar57 = vpcmpeqb_avx(auVar59,auVar57);
          auVar56 = vsubps_avx(auVar84,local_1500);
          auVar71._0_4_ = auVar56._0_4_ * local_1520;
          auVar71._4_4_ = auVar56._4_4_ * fStack_151c;
          auVar71._8_4_ = auVar56._8_4_ * fStack_1518;
          auVar71._12_4_ = auVar56._12_4_ * fStack_1514;
          auVar56 = vsubps_avx(auVar85,local_1510);
          auVar108._0_4_ = auVar56._0_4_ * local_1530;
          auVar108._4_4_ = auVar56._4_4_ * fStack_152c;
          auVar108._8_4_ = auVar56._8_4_ * fStack_1528;
          auVar108._12_4_ = auVar56._12_4_ * fStack_1524;
          auVar56 = vsubps_avx(auVar55,local_1500);
          auVar101._0_4_ = local_14c0 * auVar56._0_4_;
          auVar101._4_4_ = fStack_14bc * auVar56._4_4_;
          auVar101._8_4_ = fStack_14b8 * auVar56._8_4_;
          auVar101._12_4_ = fStack_14b4 * auVar56._12_4_;
          auVar56 = vsubps_avx(auVar99,local_1510);
          auVar113._0_4_ = local_14d0 * auVar56._0_4_;
          auVar113._4_4_ = fStack_14cc * auVar56._4_4_;
          auVar113._8_4_ = fStack_14c8 * auVar56._8_4_;
          auVar113._12_4_ = fStack_14c4 * auVar56._12_4_;
          auVar84 = vpminsd_avx(auVar71,auVar101);
          auVar56 = vpmaxsd_avx(auVar71,auVar101);
          auVar55 = vpminsd_avx(auVar108,auVar113);
          auVar84 = vpmaxsd_avx(auVar84,auVar55);
          auVar55 = vpmaxsd_avx(auVar108,auVar113);
          auVar85 = vsubps_avx(auVar100,local_1640);
          auVar114._0_4_ = local_14b0 * auVar85._0_4_;
          auVar114._4_4_ = fStack_14ac * auVar85._4_4_;
          auVar114._8_4_ = fStack_14a8 * auVar85._8_4_;
          auVar114._12_4_ = fStack_14a4 * auVar85._12_4_;
          auVar85 = vsubps_avx(auVar105,local_1640);
          auVar88._0_4_ = local_14e0 * auVar85._0_4_;
          auVar88._4_4_ = fStack_14dc * auVar85._4_4_;
          auVar88._8_4_ = fStack_14d8 * auVar85._8_4_;
          auVar88._12_4_ = fStack_14d4 * auVar85._12_4_;
          auVar85 = vpminsd_avx(auVar56,auVar55);
          auVar55 = vpminsd_avx(auVar114,auVar88);
          auVar56 = vpmaxsd_avx(auVar114,auVar88);
          auVar55 = vpmaxsd_avx(auVar55,local_14f0);
          local_13f0 = vpmaxsd_avx(auVar84,auVar55);
          auVar56 = vpminsd_avx(auVar56,local_1410);
          auVar56 = vpminsd_avx(auVar85,auVar56);
          auVar84 = vpmovsxbd_avx(auVar57);
          auVar57 = vpcmpgtd_avx(local_13f0,auVar56);
          auVar57 = vpandn_avx(auVar57,auVar84);
          uVar42 = vmovmskps_avx(auVar57);
          fVar95 = local_14b0;
          fVar98 = fStack_14ac;
          fVar96 = fStack_14a8;
          fVar155 = fStack_14a4;
          fVar159 = local_14c0;
          fVar162 = fStack_14bc;
          fVar163 = fStack_14b8;
          fVar164 = fStack_14b4;
          fVar167 = local_14d0;
          fVar174 = fStack_14cc;
          fVar81 = fStack_14c8;
          fVar82 = fStack_14c4;
          fVar147 = local_14e0;
          fVar152 = fStack_14dc;
          fVar153 = fStack_14d8;
          fVar154 = fStack_14d4;
          if (uVar42 != 0) {
            local_1690 = local_1690 + uVar54;
            local_15c8 = (ulong)(uVar42 & 0xff);
            do {
              pRVar36 = local_15f8;
              lVar15 = 0;
              for (uVar40 = local_15c8; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                  ) {
                lVar15 = lVar15 + 1;
              }
              fVar97 = *(float *)(ray + k * 4 + 0x100);
              if (*(float *)(local_13f0 + lVar15 * 4) <= fVar97) {
                local_1400 = ZEXT416((uint)fVar97);
                uVar3 = *(ushort *)(local_1690 + lVar15 * 8);
                uVar4 = *(ushort *)(local_1690 + 2 + lVar15 * 8);
                uStack_1478 = *(uint *)(local_1690 + 0x88);
                local_1660._4_4_ = *(uint *)(local_1690 + 4 + lVar15 * 8);
                local_1688 = (ulong)local_1660._4_4_;
                local_15d0 = context->scene;
                pGVar6 = (local_15d0->geometries).items[uStack_1478].ptr;
                local_15d8 = *(long *)&pGVar6->field_0x58;
                BVar2 = pGVar6->time_range;
                auVar60._8_8_ = 0;
                auVar60._0_4_ = BVar2.lower;
                auVar60._4_4_ = BVar2.upper;
                fVar83 = BVar2.lower;
                auVar73._4_4_ = fVar83;
                auVar73._0_4_ = fVar83;
                auVar73._8_4_ = fVar83;
                auVar73._12_4_ = fVar83;
                auVar73._16_4_ = fVar83;
                auVar73._20_4_ = fVar83;
                auVar73._24_4_ = fVar83;
                auVar73._28_4_ = fVar83;
                fVar83 = pGVar6->fnumTimeSegments;
                auVar61 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar73);
                auVar57 = vmovshdup_avx(auVar60);
                auVar57 = vsubps_avx(auVar57,auVar60);
                auVar63._0_4_ = auVar57._0_4_;
                auVar63._4_4_ = auVar63._0_4_;
                auVar63._8_4_ = auVar63._0_4_;
                auVar63._12_4_ = auVar63._0_4_;
                auVar63._16_4_ = auVar63._0_4_;
                auVar63._20_4_ = auVar63._0_4_;
                auVar63._24_4_ = auVar63._0_4_;
                auVar63._28_4_ = auVar63._0_4_;
                auVar61 = vdivps_avx(auVar61,auVar63);
                local_15e0 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * local_1688;
                auVar14._4_4_ = fVar83 * auVar61._4_4_;
                auVar14._0_4_ = fVar83 * auVar61._0_4_;
                auVar14._8_4_ = fVar83 * auVar61._8_4_;
                auVar14._12_4_ = fVar83 * auVar61._12_4_;
                auVar14._16_4_ = fVar83 * auVar61._16_4_;
                auVar14._20_4_ = fVar83 * auVar61._20_4_;
                auVar14._24_4_ = fVar83 * auVar61._24_4_;
                auVar14._28_4_ = auVar61._28_4_;
                auVar61 = vroundps_avx(auVar14,1);
                fVar83 = fVar83 + -1.0;
                auVar89._4_4_ = fVar83;
                auVar89._0_4_ = fVar83;
                auVar89._8_4_ = fVar83;
                auVar89._12_4_ = fVar83;
                auVar89._16_4_ = fVar83;
                auVar89._20_4_ = fVar83;
                auVar89._24_4_ = fVar83;
                auVar89._28_4_ = fVar83;
                auVar61 = vminps_avx(auVar61,auVar89);
                auVar61 = vmaxps_avx(auVar61,_DAT_01faff00);
                local_10e0 = vsubps_avx(auVar14,auVar61);
                local_1100 = vcvtps2dq_avx(auVar61);
                local_1694 = uVar3 & 0x7fff;
                local_1698 = uVar4 & 0x7fff;
                uVar42 = *(uint *)(local_15d8 + 4 + local_15e0);
                uVar47 = (ulong)uVar42;
                uVar45 = (ulong)(uVar42 * local_1698 +
                                *(int *)(local_15d8 + local_15e0) + local_1694);
                lVar7 = *(long *)&pGVar6[2].numPrimitives;
                lVar52 = (long)*(int *)(local_1100 + k * 4) * 0x38;
                lVar8 = *(long *)(lVar7 + 0x10 + lVar52);
                lVar9 = *(long *)(lVar7 + lVar52);
                auVar57 = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar45);
                lVar10 = *(long *)(lVar7 + 0x48 + lVar52);
                auVar56 = *(undefined1 (*) [16])(lVar9 + (uVar45 + 1) * lVar8);
                lVar15 = uVar45 + uVar47;
                auVar84 = *(undefined1 (*) [16])(lVar9 + lVar15 * lVar8);
                lVar44 = uVar45 + uVar47 + 1;
                auVar85 = *(undefined1 (*) [16])(lVar9 + lVar44 * lVar8);
                lVar41 = uVar45 + (-1 < (short)uVar3) + 1;
                auVar55 = *(undefined1 (*) [16])(lVar9 + lVar41 * lVar8);
                lVar51 = (ulong)(-1 < (short)uVar3) + lVar44;
                auVar99 = *(undefined1 (*) [16])(lVar9 + lVar51 * lVar8);
                uVar48 = 0;
                if (-1 < (short)uVar4) {
                  uVar48 = uVar47;
                }
                auVar100 = *(undefined1 (*) [16])(lVar9 + (lVar15 + uVar48) * lVar8);
                auVar105 = *(undefined1 (*) [16])(lVar9 + (lVar44 + uVar48) * lVar8);
                auVar69 = *(undefined1 (*) [16])(lVar9 + lVar8 * (uVar48 + lVar51));
                lVar7 = *(long *)(lVar7 + 0x38 + lVar52);
                uVar124 = *(undefined4 *)(local_10e0 + k * 4);
                auVar191._4_4_ = uVar124;
                auVar191._0_4_ = uVar124;
                auVar191._8_4_ = uVar124;
                auVar191._12_4_ = uVar124;
                auVar86 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * uVar45),auVar57);
                auVar86 = vfmadd213ps_fma(auVar86,auVar191,auVar57);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * (uVar45 + 1)),auVar56);
                auVar106 = vfmadd213ps_fma(auVar57,auVar191,auVar56);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * lVar15),auVar84);
                auVar59 = vfmadd213ps_fma(auVar57,auVar191,auVar84);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * lVar44),auVar85);
                auVar71 = vfmadd213ps_fma(auVar57,auVar191,auVar85);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * lVar41),auVar55);
                auVar56 = vfmadd213ps_fma(auVar57,auVar191,auVar55);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * lVar51),auVar99);
                auVar58 = vfmadd213ps_fma(auVar57,auVar191,auVar99);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * (lVar15 + uVar48)),
                                     auVar100);
                auVar70 = vfmadd213ps_fma(auVar57,auVar191,auVar100);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + lVar10 * (lVar44 + uVar48)),
                                     auVar105);
                auVar87 = vfmadd213ps_fma(auVar57,auVar191,auVar105);
                auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar7 + (uVar48 + lVar51) * lVar10),
                                     auVar69);
                auVar69 = vfmadd213ps_fma(auVar57,auVar191,auVar69);
                auVar84 = vunpcklps_avx(auVar106,auVar58);
                auVar57 = vunpckhps_avx(auVar106,auVar58);
                auVar55 = vunpcklps_avx(auVar56,auVar71);
                auVar56 = vunpckhps_avx(auVar56,auVar71);
                auVar85 = vunpcklps_avx(auVar57,auVar56);
                auVar99 = vunpcklps_avx(auVar84,auVar55);
                auVar57 = vunpckhps_avx(auVar84,auVar55);
                auVar55 = vunpcklps_avx(auVar59,auVar87);
                auVar56 = vunpckhps_avx(auVar59,auVar87);
                auVar100 = vunpcklps_avx(auVar71,auVar70);
                auVar84 = vunpckhps_avx(auVar71,auVar70);
                auVar84 = vunpcklps_avx(auVar56,auVar84);
                auVar105 = vunpcklps_avx(auVar55,auVar100);
                auVar56 = vunpckhps_avx(auVar55,auVar100);
                auVar117._16_16_ = auVar87;
                auVar117._0_16_ = auVar59;
                auVar74._16_16_ = auVar58;
                auVar74._0_16_ = auVar106;
                auVar61 = vunpcklps_avx(auVar74,auVar117);
                auVar133._16_16_ = auVar71;
                auVar133._0_16_ = auVar86;
                auVar64._16_16_ = auVar69;
                auVar64._0_16_ = auVar71;
                auVar62 = vunpcklps_avx(auVar133,auVar64);
                auVar14 = vunpcklps_avx(auVar62,auVar61);
                auVar61 = vunpckhps_avx(auVar62,auVar61);
                auVar62 = vunpckhps_avx(auVar74,auVar117);
                auVar72 = vunpckhps_avx(auVar133,auVar64);
                auVar62 = vunpcklps_avx(auVar72,auVar62);
                auVar75._16_16_ = auVar99;
                auVar75._0_16_ = auVar99;
                auVar109._16_16_ = auVar57;
                auVar109._0_16_ = auVar57;
                auVar118._16_16_ = auVar85;
                auVar118._0_16_ = auVar85;
                auVar127._16_16_ = auVar105;
                auVar127._0_16_ = auVar105;
                auVar134._16_16_ = auVar56;
                auVar134._0_16_ = auVar56;
                uVar124 = *(undefined4 *)(local_15f8 + k * 4);
                auVar140._4_4_ = uVar124;
                auVar140._0_4_ = uVar124;
                auVar140._8_4_ = uVar124;
                auVar140._12_4_ = uVar124;
                auVar140._16_4_ = uVar124;
                auVar140._20_4_ = uVar124;
                auVar140._24_4_ = uVar124;
                auVar140._28_4_ = uVar124;
                uVar124 = *(undefined4 *)(local_15f8 + k * 4 + 0x20);
                auVar144._4_4_ = uVar124;
                auVar144._0_4_ = uVar124;
                auVar144._8_4_ = uVar124;
                auVar144._12_4_ = uVar124;
                auVar144._16_4_ = uVar124;
                auVar144._20_4_ = uVar124;
                auVar144._24_4_ = uVar124;
                auVar144._28_4_ = uVar124;
                auVar102._16_16_ = auVar84;
                auVar102._0_16_ = auVar84;
                uVar124 = *(undefined4 *)(local_15f8 + k * 4 + 0x40);
                auVar150._4_4_ = uVar124;
                auVar150._0_4_ = uVar124;
                auVar150._8_4_ = uVar124;
                auVar150._12_4_ = uVar124;
                auVar150._16_4_ = uVar124;
                auVar150._20_4_ = uVar124;
                auVar150._24_4_ = uVar124;
                auVar150._28_4_ = uVar124;
                auVar14 = vsubps_avx(auVar14,auVar140);
                local_14a0 = vsubps_avx(auVar61,auVar144);
                local_1560 = vsubps_avx(auVar62,auVar150);
                auVar61 = vsubps_avx(auVar75,auVar140);
                auVar62 = vsubps_avx(auVar109,auVar144);
                auVar72 = vsubps_avx(auVar118,auVar150);
                auVar63 = vsubps_avx(auVar127,auVar140);
                auVar73 = vsubps_avx(auVar134,auVar144);
                auVar89 = vsubps_avx(auVar102,auVar150);
                local_1120 = vsubps_avx(auVar63,auVar14);
                local_1160 = vsubps_avx(auVar73,local_14a0);
                local_1140 = vsubps_avx(auVar89,local_1560);
                auVar65._0_4_ = auVar14._0_4_ + auVar63._0_4_;
                auVar65._4_4_ = auVar14._4_4_ + auVar63._4_4_;
                auVar65._8_4_ = auVar14._8_4_ + auVar63._8_4_;
                auVar65._12_4_ = auVar14._12_4_ + auVar63._12_4_;
                auVar65._16_4_ = auVar14._16_4_ + auVar63._16_4_;
                auVar65._20_4_ = auVar14._20_4_ + auVar63._20_4_;
                auVar65._24_4_ = auVar14._24_4_ + auVar63._24_4_;
                auVar65._28_4_ = auVar14._28_4_ + auVar63._28_4_;
                auVar103._0_4_ = auVar73._0_4_ + local_14a0._0_4_;
                auVar103._4_4_ = auVar73._4_4_ + local_14a0._4_4_;
                auVar103._8_4_ = auVar73._8_4_ + local_14a0._8_4_;
                auVar103._12_4_ = auVar73._12_4_ + local_14a0._12_4_;
                auVar103._16_4_ = auVar73._16_4_ + local_14a0._16_4_;
                auVar103._20_4_ = auVar73._20_4_ + local_14a0._20_4_;
                auVar103._24_4_ = auVar73._24_4_ + local_14a0._24_4_;
                auVar103._28_4_ = auVar73._28_4_ + local_14a0._28_4_;
                fVar165 = local_1560._0_4_;
                auVar128._0_4_ = fVar165 + auVar89._0_4_;
                fVar172 = local_1560._4_4_;
                auVar128._4_4_ = fVar172 + auVar89._4_4_;
                fVar175 = local_1560._8_4_;
                auVar128._8_4_ = fVar175 + auVar89._8_4_;
                fVar177 = local_1560._12_4_;
                auVar128._12_4_ = fVar177 + auVar89._12_4_;
                fVar179 = local_1560._16_4_;
                auVar128._16_4_ = fVar179 + auVar89._16_4_;
                fVar181 = local_1560._20_4_;
                auVar128._20_4_ = fVar181 + auVar89._20_4_;
                fVar183 = local_1560._24_4_;
                auVar128._24_4_ = fVar183 + auVar89._24_4_;
                auVar128._28_4_ = local_1560._28_4_ + auVar89._28_4_;
                auVar12._4_4_ = local_1140._4_4_ * auVar103._4_4_;
                auVar12._0_4_ = local_1140._0_4_ * auVar103._0_4_;
                auVar12._8_4_ = local_1140._8_4_ * auVar103._8_4_;
                auVar12._12_4_ = local_1140._12_4_ * auVar103._12_4_;
                auVar12._16_4_ = local_1140._16_4_ * auVar103._16_4_;
                auVar12._20_4_ = local_1140._20_4_ * auVar103._20_4_;
                auVar12._24_4_ = local_1140._24_4_ * auVar103._24_4_;
                auVar12._28_4_ = auVar56._12_4_;
                auVar56 = vfmsub231ps_fma(auVar12,local_1160,auVar128);
                auVar13._4_4_ = local_1120._4_4_ * auVar128._4_4_;
                auVar13._0_4_ = local_1120._0_4_ * auVar128._0_4_;
                auVar13._8_4_ = local_1120._8_4_ * auVar128._8_4_;
                auVar13._12_4_ = local_1120._12_4_ * auVar128._12_4_;
                auVar13._16_4_ = local_1120._16_4_ * auVar128._16_4_;
                auVar13._20_4_ = local_1120._20_4_ * auVar128._20_4_;
                auVar13._24_4_ = local_1120._24_4_ * auVar128._24_4_;
                auVar13._28_4_ = auVar128._28_4_;
                auVar57 = vfmsub231ps_fma(auVar13,local_1140,auVar65);
                auVar16._4_4_ = local_1160._4_4_ * auVar65._4_4_;
                auVar16._0_4_ = local_1160._0_4_ * auVar65._0_4_;
                auVar16._8_4_ = local_1160._8_4_ * auVar65._8_4_;
                auVar16._12_4_ = local_1160._12_4_ * auVar65._12_4_;
                auVar16._16_4_ = local_1160._16_4_ * auVar65._16_4_;
                auVar16._20_4_ = local_1160._20_4_ * auVar65._20_4_;
                auVar16._24_4_ = local_1160._24_4_ * auVar65._24_4_;
                auVar16._28_4_ = auVar65._28_4_;
                auVar84 = vfmsub231ps_fma(auVar16,local_1120,auVar103);
                uVar124 = *(undefined4 *)(local_15f8 + k * 4 + 0xa0);
                local_1680._4_4_ = uVar124;
                local_1680._0_4_ = uVar124;
                local_1680._8_4_ = uVar124;
                local_1680._12_4_ = uVar124;
                local_1680._16_4_ = uVar124;
                local_1680._20_4_ = uVar124;
                local_1680._24_4_ = uVar124;
                local_1680._28_4_ = uVar124;
                fVar83 = *(float *)(local_15f8 + k * 4 + 0xc0);
                local_1180._4_4_ = fVar83;
                local_1180._0_4_ = fVar83;
                local_1180._8_4_ = fVar83;
                local_1180._12_4_ = fVar83;
                local_1180._16_4_ = fVar83;
                local_1180._20_4_ = fVar83;
                local_1180._24_4_ = fVar83;
                local_1180._28_4_ = fVar83;
                auVar17._4_4_ = auVar84._4_4_ * fVar83;
                auVar17._0_4_ = auVar84._0_4_ * fVar83;
                auVar17._8_4_ = auVar84._8_4_ * fVar83;
                auVar17._12_4_ = auVar84._12_4_ * fVar83;
                auVar17._16_4_ = fVar83 * 0.0;
                auVar17._20_4_ = fVar83 * 0.0;
                auVar17._24_4_ = fVar83 * 0.0;
                auVar17._28_4_ = local_1160._28_4_;
                auVar57 = vfmadd231ps_fma(auVar17,local_1680,ZEXT1632(auVar57));
                uVar124 = *(undefined4 *)(local_15f8 + k * 4 + 0x80);
                auVar104._4_4_ = uVar124;
                auVar104._0_4_ = uVar124;
                auVar104._8_4_ = uVar124;
                auVar104._12_4_ = uVar124;
                auVar104._16_4_ = uVar124;
                auVar104._20_4_ = uVar124;
                auVar104._24_4_ = uVar124;
                auVar104._28_4_ = uVar124;
                auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar104,ZEXT1632(auVar56));
                local_11a0 = vsubps_avx(local_14a0,auVar62);
                local_11c0 = vsubps_avx(local_1560,auVar72);
                auVar129._0_4_ = local_14a0._0_4_ + auVar62._0_4_;
                auVar129._4_4_ = local_14a0._4_4_ + auVar62._4_4_;
                auVar129._8_4_ = local_14a0._8_4_ + auVar62._8_4_;
                auVar129._12_4_ = local_14a0._12_4_ + auVar62._12_4_;
                auVar129._16_4_ = local_14a0._16_4_ + auVar62._16_4_;
                auVar129._20_4_ = local_14a0._20_4_ + auVar62._20_4_;
                auVar129._24_4_ = local_14a0._24_4_ + auVar62._24_4_;
                fVar68 = auVar62._28_4_;
                auVar129._28_4_ = local_14a0._28_4_ + fVar68;
                auVar135._0_4_ = fVar165 + auVar72._0_4_;
                auVar135._4_4_ = fVar172 + auVar72._4_4_;
                auVar135._8_4_ = fVar175 + auVar72._8_4_;
                auVar135._12_4_ = fVar177 + auVar72._12_4_;
                auVar135._16_4_ = fVar179 + auVar72._16_4_;
                auVar135._20_4_ = fVar181 + auVar72._20_4_;
                auVar135._24_4_ = fVar183 + auVar72._24_4_;
                fVar80 = auVar72._28_4_;
                auVar135._28_4_ = local_1560._28_4_ + fVar80;
                fVar91 = local_11c0._0_4_;
                fVar93 = local_11c0._4_4_;
                auVar18._4_4_ = auVar129._4_4_ * fVar93;
                auVar18._0_4_ = auVar129._0_4_ * fVar91;
                fVar95 = local_11c0._8_4_;
                auVar18._8_4_ = auVar129._8_4_ * fVar95;
                fVar96 = local_11c0._12_4_;
                auVar18._12_4_ = auVar129._12_4_ * fVar96;
                fVar159 = local_11c0._16_4_;
                auVar18._16_4_ = auVar129._16_4_ * fVar159;
                fVar163 = local_11c0._20_4_;
                auVar18._20_4_ = auVar129._20_4_ * fVar163;
                fVar167 = local_11c0._24_4_;
                auVar18._24_4_ = auVar129._24_4_ * fVar167;
                auVar18._28_4_ = fVar80;
                auVar84 = vfmsub231ps_fma(auVar18,local_11a0,auVar135);
                auVar12 = vsubps_avx(auVar14,auVar61);
                fVar166 = auVar12._0_4_;
                fVar173 = auVar12._4_4_;
                auVar19._4_4_ = fVar173 * auVar135._4_4_;
                auVar19._0_4_ = fVar166 * auVar135._0_4_;
                fVar176 = auVar12._8_4_;
                auVar19._8_4_ = fVar176 * auVar135._8_4_;
                fVar178 = auVar12._12_4_;
                auVar19._12_4_ = fVar178 * auVar135._12_4_;
                fVar180 = auVar12._16_4_;
                auVar19._16_4_ = fVar180 * auVar135._16_4_;
                fVar182 = auVar12._20_4_;
                auVar19._20_4_ = fVar182 * auVar135._20_4_;
                fVar184 = auVar12._24_4_;
                auVar19._24_4_ = fVar184 * auVar135._24_4_;
                auVar19._28_4_ = local_1140._28_4_;
                auVar136._0_4_ = auVar14._0_4_ + auVar61._0_4_;
                auVar136._4_4_ = auVar14._4_4_ + auVar61._4_4_;
                auVar136._8_4_ = auVar14._8_4_ + auVar61._8_4_;
                auVar136._12_4_ = auVar14._12_4_ + auVar61._12_4_;
                auVar136._16_4_ = auVar14._16_4_ + auVar61._16_4_;
                auVar136._20_4_ = auVar14._20_4_ + auVar61._20_4_;
                auVar136._24_4_ = auVar14._24_4_ + auVar61._24_4_;
                auVar136._28_4_ = auVar14._28_4_ + auVar61._28_4_;
                auVar56 = vfmsub231ps_fma(auVar19,local_11c0,auVar136);
                fVar92 = local_11a0._0_4_;
                fVar94 = local_11a0._4_4_;
                auVar20._4_4_ = auVar136._4_4_ * fVar94;
                auVar20._0_4_ = auVar136._0_4_ * fVar92;
                fVar98 = local_11a0._8_4_;
                auVar20._8_4_ = auVar136._8_4_ * fVar98;
                fVar155 = local_11a0._12_4_;
                auVar20._12_4_ = auVar136._12_4_ * fVar155;
                fVar162 = local_11a0._16_4_;
                auVar20._16_4_ = auVar136._16_4_ * fVar162;
                fVar164 = local_11a0._20_4_;
                auVar20._20_4_ = auVar136._20_4_ * fVar164;
                fVar174 = local_11a0._24_4_;
                auVar20._24_4_ = auVar136._24_4_ * fVar174;
                auVar20._28_4_ = auVar136._28_4_;
                auVar55 = vfmsub231ps_fma(auVar20,auVar12,auVar129);
                auVar21._4_4_ = auVar55._4_4_ * fVar83;
                auVar21._0_4_ = auVar55._0_4_ * fVar83;
                auVar21._8_4_ = auVar55._8_4_ * fVar83;
                auVar21._12_4_ = auVar55._12_4_ * fVar83;
                auVar21._16_4_ = fVar83 * 0.0;
                auVar21._20_4_ = fVar83 * 0.0;
                auVar21._24_4_ = fVar83 * 0.0;
                auVar21._28_4_ = auVar12._28_4_;
                auVar56 = vfmadd231ps_fma(auVar21,local_1680,ZEXT1632(auVar56));
                auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar104,ZEXT1632(auVar84));
                auVar13 = vsubps_avx(auVar61,auVar63);
                auVar119._0_4_ = auVar61._0_4_ + auVar63._0_4_;
                auVar119._4_4_ = auVar61._4_4_ + auVar63._4_4_;
                auVar119._8_4_ = auVar61._8_4_ + auVar63._8_4_;
                auVar119._12_4_ = auVar61._12_4_ + auVar63._12_4_;
                auVar119._16_4_ = auVar61._16_4_ + auVar63._16_4_;
                auVar119._20_4_ = auVar61._20_4_ + auVar63._20_4_;
                auVar119._24_4_ = auVar61._24_4_ + auVar63._24_4_;
                auVar119._28_4_ = auVar61._28_4_ + auVar63._28_4_;
                auVar63 = vsubps_avx(auVar62,auVar73);
                auVar141._0_4_ = auVar73._0_4_ + auVar62._0_4_;
                auVar141._4_4_ = auVar73._4_4_ + auVar62._4_4_;
                auVar141._8_4_ = auVar73._8_4_ + auVar62._8_4_;
                auVar141._12_4_ = auVar73._12_4_ + auVar62._12_4_;
                auVar141._16_4_ = auVar73._16_4_ + auVar62._16_4_;
                auVar141._20_4_ = auVar73._20_4_ + auVar62._20_4_;
                auVar141._24_4_ = auVar73._24_4_ + auVar62._24_4_;
                auVar141._28_4_ = auVar73._28_4_ + fVar68;
                auVar73 = vsubps_avx(auVar72,auVar89);
                auVar76._0_4_ = auVar72._0_4_ + auVar89._0_4_;
                auVar76._4_4_ = auVar72._4_4_ + auVar89._4_4_;
                auVar76._8_4_ = auVar72._8_4_ + auVar89._8_4_;
                auVar76._12_4_ = auVar72._12_4_ + auVar89._12_4_;
                auVar76._16_4_ = auVar72._16_4_ + auVar89._16_4_;
                auVar76._20_4_ = auVar72._20_4_ + auVar89._20_4_;
                auVar76._24_4_ = auVar72._24_4_ + auVar89._24_4_;
                auVar76._28_4_ = fVar80 + auVar89._28_4_;
                auVar22._4_4_ = auVar141._4_4_ * auVar73._4_4_;
                auVar22._0_4_ = auVar141._0_4_ * auVar73._0_4_;
                auVar22._8_4_ = auVar141._8_4_ * auVar73._8_4_;
                auVar22._12_4_ = auVar141._12_4_ * auVar73._12_4_;
                auVar22._16_4_ = auVar141._16_4_ * auVar73._16_4_;
                auVar22._20_4_ = auVar141._20_4_ * auVar73._20_4_;
                auVar22._24_4_ = auVar141._24_4_ * auVar73._24_4_;
                auVar22._28_4_ = fVar68;
                auVar55 = vfmsub231ps_fma(auVar22,auVar63,auVar76);
                auVar23._4_4_ = auVar76._4_4_ * auVar13._4_4_;
                auVar23._0_4_ = auVar76._0_4_ * auVar13._0_4_;
                auVar23._8_4_ = auVar76._8_4_ * auVar13._8_4_;
                auVar23._12_4_ = auVar76._12_4_ * auVar13._12_4_;
                auVar23._16_4_ = auVar76._16_4_ * auVar13._16_4_;
                auVar23._20_4_ = auVar76._20_4_ * auVar13._20_4_;
                auVar23._24_4_ = auVar76._24_4_ * auVar13._24_4_;
                auVar23._28_4_ = auVar76._28_4_;
                auVar84 = vfmsub231ps_fma(auVar23,auVar73,auVar119);
                auVar24._4_4_ = auVar119._4_4_ * auVar63._4_4_;
                auVar24._0_4_ = auVar119._0_4_ * auVar63._0_4_;
                auVar24._8_4_ = auVar119._8_4_ * auVar63._8_4_;
                auVar24._12_4_ = auVar119._12_4_ * auVar63._12_4_;
                auVar24._16_4_ = auVar119._16_4_ * auVar63._16_4_;
                auVar24._20_4_ = auVar119._20_4_ * auVar63._20_4_;
                auVar24._24_4_ = auVar119._24_4_ * auVar63._24_4_;
                auVar24._28_4_ = auVar119._28_4_;
                auVar85 = vfmsub231ps_fma(auVar24,auVar13,auVar141);
                auVar120._0_4_ = auVar85._0_4_ * fVar83;
                auVar120._4_4_ = auVar85._4_4_ * fVar83;
                auVar120._8_4_ = auVar85._8_4_ * fVar83;
                auVar120._12_4_ = auVar85._12_4_ * fVar83;
                auVar120._16_4_ = fVar83 * 0.0;
                auVar120._20_4_ = fVar83 * 0.0;
                auVar120._24_4_ = fVar83 * 0.0;
                auVar120._28_4_ = 0;
                auVar84 = vfmadd231ps_fma(auVar120,local_1680,ZEXT1632(auVar84));
                auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar104,ZEXT1632(auVar55));
                fVar68 = auVar84._0_4_ + auVar57._0_4_ + auVar56._0_4_;
                fVar80 = auVar84._4_4_ + auVar57._4_4_ + auVar56._4_4_;
                fVar81 = auVar84._8_4_ + auVar57._8_4_ + auVar56._8_4_;
                fVar82 = auVar84._12_4_ + auVar57._12_4_ + auVar56._12_4_;
                local_11e0 = ZEXT1632(CONCAT412(fVar82,CONCAT48(fVar81,CONCAT44(fVar80,fVar68))));
                auVar110._8_4_ = 0x7fffffff;
                auVar110._0_8_ = 0x7fffffff7fffffff;
                auVar110._12_4_ = 0x7fffffff;
                auVar110._16_4_ = 0x7fffffff;
                auVar110._20_4_ = 0x7fffffff;
                auVar110._24_4_ = 0x7fffffff;
                auVar110._28_4_ = 0x7fffffff;
                local_1200 = ZEXT1632(auVar57);
                auVar61 = vminps_avx(local_1200,ZEXT1632(auVar56));
                auVar61 = vminps_avx(auVar61,ZEXT1632(auVar84));
                local_1220 = vandps_avx(local_11e0,auVar110);
                fVar147 = local_1220._0_4_ * 1.1920929e-07;
                fVar152 = local_1220._4_4_ * 1.1920929e-07;
                auVar25._4_4_ = fVar152;
                auVar25._0_4_ = fVar147;
                fVar153 = local_1220._8_4_ * 1.1920929e-07;
                auVar25._8_4_ = fVar153;
                fVar154 = local_1220._12_4_ * 1.1920929e-07;
                auVar25._12_4_ = fVar154;
                fVar156 = local_1220._16_4_ * 1.1920929e-07;
                auVar25._16_4_ = fVar156;
                fVar157 = local_1220._20_4_ * 1.1920929e-07;
                auVar25._20_4_ = fVar157;
                fVar158 = local_1220._24_4_ * 1.1920929e-07;
                auVar25._24_4_ = fVar158;
                auVar25._28_4_ = 0x34000000;
                auVar145._0_8_ = CONCAT44(fVar152,fVar147) ^ 0x8000000080000000;
                auVar145._8_4_ = -fVar153;
                auVar145._12_4_ = -fVar154;
                auVar145._16_4_ = -fVar156;
                auVar145._20_4_ = -fVar157;
                auVar145._24_4_ = -fVar158;
                auVar145._28_4_ = 0xb4000000;
                auVar61 = vcmpps_avx(auVar61,auVar145,5);
                auVar89 = ZEXT1632(auVar56);
                auVar72 = vmaxps_avx(local_1200,auVar89);
                auVar62 = vmaxps_avx(auVar72,ZEXT1632(auVar84));
                auVar62 = vcmpps_avx(auVar62,auVar25,2);
                auVar62 = vorps_avx(auVar61,auVar62);
                if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar62 >> 0x7f,0) != '\0') ||
                      (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar62 >> 0xbf,0) != '\0') ||
                    (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar62[0x1f] < '\0') {
                  auVar26._4_4_ = fVar94 * local_1140._4_4_;
                  auVar26._0_4_ = fVar92 * local_1140._0_4_;
                  auVar26._8_4_ = fVar98 * local_1140._8_4_;
                  auVar26._12_4_ = fVar155 * local_1140._12_4_;
                  auVar26._16_4_ = fVar162 * local_1140._16_4_;
                  auVar26._20_4_ = fVar164 * local_1140._20_4_;
                  auVar26._24_4_ = fVar174 * local_1140._24_4_;
                  auVar26._28_4_ = auVar61._28_4_;
                  auVar27._4_4_ = fVar173 * local_1160._4_4_;
                  auVar27._0_4_ = fVar166 * local_1160._0_4_;
                  auVar27._8_4_ = fVar176 * local_1160._8_4_;
                  auVar27._12_4_ = fVar178 * local_1160._12_4_;
                  auVar27._16_4_ = fVar180 * local_1160._16_4_;
                  auVar27._20_4_ = fVar182 * local_1160._20_4_;
                  auVar27._24_4_ = fVar184 * local_1160._24_4_;
                  auVar27._28_4_ = auVar72._28_4_;
                  auVar57 = vfmsub213ps_fma(local_1160,local_11c0,auVar26);
                  auVar28._4_4_ = auVar63._4_4_ * fVar93;
                  auVar28._0_4_ = auVar63._0_4_ * fVar91;
                  auVar28._8_4_ = auVar63._8_4_ * fVar95;
                  auVar28._12_4_ = auVar63._12_4_ * fVar96;
                  auVar28._16_4_ = auVar63._16_4_ * fVar159;
                  auVar28._20_4_ = auVar63._20_4_ * fVar163;
                  auVar28._24_4_ = auVar63._24_4_ * fVar167;
                  auVar28._28_4_ = 0x34000000;
                  auVar29._4_4_ = fVar173 * auVar73._4_4_;
                  auVar29._0_4_ = fVar166 * auVar73._0_4_;
                  auVar29._8_4_ = fVar176 * auVar73._8_4_;
                  auVar29._12_4_ = fVar178 * auVar73._12_4_;
                  auVar29._16_4_ = fVar180 * auVar73._16_4_;
                  auVar29._20_4_ = fVar182 * auVar73._20_4_;
                  auVar29._24_4_ = fVar184 * auVar73._24_4_;
                  auVar29._28_4_ = local_1220._28_4_;
                  auVar84 = vfmsub213ps_fma(auVar73,local_11a0,auVar28);
                  auVar61 = vandps_avx(auVar26,auVar110);
                  auVar72 = vandps_avx(auVar28,auVar110);
                  auVar61 = vcmpps_avx(auVar61,auVar72,1);
                  auVar73 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar57),auVar61);
                  auVar30._4_4_ = auVar13._4_4_ * fVar94;
                  auVar30._0_4_ = auVar13._0_4_ * fVar92;
                  auVar30._8_4_ = auVar13._8_4_ * fVar98;
                  auVar30._12_4_ = auVar13._12_4_ * fVar155;
                  auVar30._16_4_ = auVar13._16_4_ * fVar162;
                  auVar30._20_4_ = auVar13._20_4_ * fVar164;
                  auVar30._24_4_ = auVar13._24_4_ * fVar174;
                  auVar30._28_4_ = auVar72._28_4_;
                  auVar57 = vfmsub213ps_fma(auVar13,local_11c0,auVar29);
                  auVar31._4_4_ = local_1120._4_4_ * fVar93;
                  auVar31._0_4_ = local_1120._0_4_ * fVar91;
                  auVar31._8_4_ = local_1120._8_4_ * fVar95;
                  auVar31._12_4_ = local_1120._12_4_ * fVar96;
                  auVar31._16_4_ = local_1120._16_4_ * fVar159;
                  auVar31._20_4_ = local_1120._20_4_ * fVar163;
                  auVar31._24_4_ = local_1120._24_4_ * fVar167;
                  auVar31._28_4_ = local_11c0._28_4_;
                  auVar84 = vfmsub213ps_fma(local_1140,auVar12,auVar31);
                  auVar61 = vandps_avx(auVar31,auVar110);
                  auVar72 = vandps_avx(auVar29,auVar110);
                  auVar61 = vcmpps_avx(auVar61,auVar72,1);
                  auVar13 = vblendvps_avx(ZEXT1632(auVar57),ZEXT1632(auVar84),auVar61);
                  auVar57 = vfmsub213ps_fma(local_1120,local_11a0,auVar27);
                  auVar84 = vfmsub213ps_fma(auVar63,auVar12,auVar30);
                  auVar61 = vandps_avx(auVar27,auVar110);
                  auVar72 = vandps_avx(auVar30,auVar110);
                  auVar61 = vcmpps_avx(auVar61,auVar72,1);
                  auVar72 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar57),auVar61);
                  auVar57 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
                  fVar91 = auVar72._0_4_;
                  auVar66._0_4_ = fVar91 * fVar83;
                  fVar92 = auVar72._4_4_;
                  auVar66._4_4_ = fVar92 * fVar83;
                  fVar93 = auVar72._8_4_;
                  auVar66._8_4_ = fVar93 * fVar83;
                  fVar94 = auVar72._12_4_;
                  auVar66._12_4_ = fVar94 * fVar83;
                  fVar95 = auVar72._16_4_;
                  auVar66._16_4_ = fVar95 * fVar83;
                  fVar98 = auVar72._20_4_;
                  auVar66._20_4_ = fVar98 * fVar83;
                  fVar96 = auVar72._24_4_;
                  auVar66._24_4_ = fVar96 * fVar83;
                  auVar66._28_4_ = 0;
                  auVar84 = vfmadd213ps_fma(local_1680,auVar13,auVar66);
                  auVar84 = vfmadd213ps_fma(auVar104,auVar73,ZEXT1632(auVar84));
                  auVar63 = ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                               CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                        CONCAT44(auVar84._4_4_ + auVar84._4_4_,
                                                                 auVar84._0_4_ + auVar84._0_4_))));
                  auVar32._4_4_ = fVar92 * fVar172;
                  auVar32._0_4_ = fVar91 * fVar165;
                  auVar32._8_4_ = fVar93 * fVar175;
                  auVar32._12_4_ = fVar94 * fVar177;
                  auVar32._16_4_ = fVar95 * fVar179;
                  auVar32._20_4_ = fVar98 * fVar181;
                  auVar32._24_4_ = fVar96 * fVar183;
                  auVar32._28_4_ = auVar62._28_4_;
                  auVar84 = vfmadd213ps_fma(local_14a0,auVar13,auVar32);
                  auVar55 = vfmadd213ps_fma(auVar14,auVar73,ZEXT1632(auVar84));
                  auVar61 = vrcpps_avx(auVar63);
                  auVar151._8_4_ = 0x3f800000;
                  auVar151._0_8_ = 0x3f8000003f800000;
                  auVar151._12_4_ = 0x3f800000;
                  auVar151._16_4_ = 0x3f800000;
                  auVar151._20_4_ = 0x3f800000;
                  auVar151._24_4_ = 0x3f800000;
                  auVar151._28_4_ = 0x3f800000;
                  auVar84 = vfnmadd213ps_fma(auVar61,auVar63,auVar151);
                  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar61,auVar61);
                  local_15c0._28_4_ = 0x3f800000;
                  local_15c0._0_28_ =
                       ZEXT1628(CONCAT412(auVar84._12_4_ * (auVar55._12_4_ + auVar55._12_4_),
                                          CONCAT48(auVar84._8_4_ * (auVar55._8_4_ + auVar55._8_4_),
                                                   CONCAT44(auVar84._4_4_ *
                                                            (auVar55._4_4_ + auVar55._4_4_),
                                                            auVar84._0_4_ *
                                                            (auVar55._0_4_ + auVar55._0_4_)))));
                  auVar123 = ZEXT3264(local_15c0);
                  uVar124 = *(undefined4 *)(local_15f8 + k * 4 + 0x60);
                  auVar121._4_4_ = uVar124;
                  auVar121._0_4_ = uVar124;
                  auVar121._8_4_ = uVar124;
                  auVar121._12_4_ = uVar124;
                  auVar121._16_4_ = uVar124;
                  auVar121._20_4_ = uVar124;
                  auVar121._24_4_ = uVar124;
                  auVar121._28_4_ = uVar124;
                  auVar61 = vcmpps_avx(auVar121,local_15c0,2);
                  auVar146._4_4_ = fVar97;
                  auVar146._0_4_ = fVar97;
                  auVar146._8_4_ = fVar97;
                  auVar146._12_4_ = fVar97;
                  auVar146._16_4_ = fVar97;
                  auVar146._20_4_ = fVar97;
                  auVar146._24_4_ = fVar97;
                  auVar146._28_4_ = fVar97;
                  auVar62 = vcmpps_avx(local_15c0,auVar146,2);
                  auVar61 = vandps_avx(auVar62,auVar61);
                  auVar84 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
                  auVar57 = vpand_avx(auVar84,auVar57);
                  auVar61 = vpmovsxwd_avx2(auVar57);
                  if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar61 >> 0x7f,0) != '\0') ||
                        (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar61 >> 0xbf,0) != '\0') ||
                      (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar61[0x1f] < '\0') {
                    auVar61 = vcmpps_avx(auVar63,_DAT_01faff00,4);
                    auVar84 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
                    auVar57 = vpand_avx(auVar57,auVar84);
                    local_1360 = vpmovsxwd_avx2(auVar57);
                    if ((((((((local_1360 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (local_1360 >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0) ||
                            (local_1360 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || SUB321(local_1360 >> 0x7f,0) != '\0') ||
                          (local_1360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(local_1360 >> 0xbf,0) != '\0') ||
                        (local_1360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_1360[0x1f] < '\0') {
                      local_13a0 = local_11e0;
                      local_1380 = &local_16a1;
                      auVar61 = vsubps_avx(local_11e0,auVar89);
                      auVar61 = vblendvps_avx(local_1200,auVar61,local_1260);
                      auVar62 = vsubps_avx(local_11e0,local_1200);
                      local_13c0 = vblendvps_avx(auVar89,auVar62,local_1260);
                      local_1300 = local_15c0;
                      local_12e0[0] = auVar73._0_4_ * (float)local_1280._0_4_;
                      local_12e0[1] = auVar73._4_4_ * (float)local_1280._4_4_;
                      local_12e0[2] = auVar73._8_4_ * fStack_1278;
                      local_12e0[3] = auVar73._12_4_ * fStack_1274;
                      fStack_12d0 = auVar73._16_4_ * fStack_1270;
                      fStack_12cc = auVar73._20_4_ * fStack_126c;
                      fStack_12c8 = auVar73._24_4_ * fStack_1268;
                      uStack_12c4 = local_1260._28_4_;
                      local_12c0[0] = (float)local_1280._0_4_ * auVar13._0_4_;
                      local_12c0[1] = (float)local_1280._4_4_ * auVar13._4_4_;
                      local_12c0[2] = fStack_1278 * auVar13._8_4_;
                      local_12c0[3] = fStack_1274 * auVar13._12_4_;
                      fStack_12b0 = fStack_1270 * auVar13._16_4_;
                      fStack_12ac = fStack_126c * auVar13._20_4_;
                      fStack_12a8 = fStack_1268 * auVar13._24_4_;
                      uStack_12a4 = local_1260._28_4_;
                      local_12a0[0] = (float)local_1280._0_4_ * fVar91;
                      local_12a0[1] = (float)local_1280._4_4_ * fVar92;
                      local_12a0[2] = fStack_1278 * fVar93;
                      local_12a0[3] = fStack_1274 * fVar94;
                      fStack_1290 = fStack_1270 * fVar95;
                      fStack_128c = fStack_126c * fVar98;
                      fStack_1288 = fStack_1268 * fVar96;
                      uStack_1284 = auVar72._28_4_;
                      auVar90._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                      auVar90._8_4_ = local_1694;
                      auVar90._12_4_ = local_1694;
                      auVar90._16_4_ = local_1694;
                      auVar90._20_4_ = local_1694;
                      auVar90._24_4_ = local_1694;
                      auVar90._28_4_ = local_1694;
                      auVar62 = vpaddd_avx2(auVar90,_DAT_01fec4a0);
                      auVar115._0_4_ = (float)(int)(*(ushort *)(local_15d8 + 8 + local_15e0) - 1);
                      auVar115._4_12_ = auVar56._4_12_;
                      auVar57 = vrcpss_avx(auVar115,auVar115);
                      auVar84 = vfnmadd213ss_fma(auVar57,auVar115,ZEXT416(0x40000000));
                      fVar97 = auVar57._0_4_ * auVar84._0_4_;
                      auVar62 = vcvtdq2ps_avx(auVar62);
                      fVar98 = auVar62._28_4_ + auVar61._28_4_;
                      fVar83 = (fVar68 * auVar62._0_4_ + auVar61._0_4_) * fVar97;
                      fVar91 = (fVar80 * auVar62._4_4_ + auVar61._4_4_) * fVar97;
                      local_13e0._4_4_ = fVar91;
                      local_13e0._0_4_ = fVar83;
                      fVar92 = (fVar81 * auVar62._8_4_ + auVar61._8_4_) * fVar97;
                      local_13e0._8_4_ = fVar92;
                      fVar93 = (fVar82 * auVar62._12_4_ + auVar61._12_4_) * fVar97;
                      local_13e0._12_4_ = fVar93;
                      fVar94 = (auVar62._16_4_ * 0.0 + auVar61._16_4_) * fVar97;
                      local_13e0._16_4_ = fVar94;
                      fVar95 = (auVar62._20_4_ * 0.0 + auVar61._20_4_) * fVar97;
                      local_13e0._20_4_ = fVar95;
                      fVar97 = (auVar62._24_4_ * 0.0 + auVar61._24_4_) * fVar97;
                      local_13e0._24_4_ = fVar97;
                      local_13e0._28_4_ = fVar98;
                      pGVar6 = (local_15d0->geometries).items[uStack_1478].ptr;
                      if ((pGVar6->mask & *(uint *)(local_15f8 + k * 4 + 0x120)) != 0) {
                        auVar111._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                        auVar111._8_4_ = local_1698;
                        auVar111._12_4_ = local_1698;
                        auVar111._16_4_ = local_1698;
                        auVar111._20_4_ = local_1698;
                        auVar111._24_4_ = local_1698;
                        auVar111._28_4_ = local_1698;
                        auVar61 = vpaddd_avx2(auVar111,_DAT_01fec4c0);
                        auVar62 = vcvtdq2ps_avx(auVar61);
                        auVar116._0_4_ = (float)(int)(*(ushort *)(local_15d8 + 10 + local_15e0) - 1)
                        ;
                        auVar116._4_12_ = auVar56._4_12_;
                        auVar57 = vrcpss_avx(auVar116,auVar116);
                        auVar56 = vfnmadd213ss_fma(auVar57,auVar116,ZEXT416(0x40000000));
                        fVar96 = auVar57._0_4_ * auVar56._0_4_;
                        auVar61 = vrcpps_avx(local_11e0);
                        auVar122._8_4_ = 0x3f800000;
                        auVar122._0_8_ = 0x3f8000003f800000;
                        auVar122._12_4_ = 0x3f800000;
                        auVar122._16_4_ = 0x3f800000;
                        auVar122._20_4_ = 0x3f800000;
                        auVar122._24_4_ = 0x3f800000;
                        auVar122._28_4_ = 0x3f800000;
                        auVar57 = vfnmadd213ps_fma(local_11e0,auVar61,auVar122);
                        auVar57 = vfmadd132ps_fma(ZEXT1632(auVar57),auVar61,auVar61);
                        auVar112._8_4_ = 0x219392ef;
                        auVar112._0_8_ = 0x219392ef219392ef;
                        auVar112._12_4_ = 0x219392ef;
                        auVar112._16_4_ = 0x219392ef;
                        auVar112._20_4_ = 0x219392ef;
                        auVar112._24_4_ = 0x219392ef;
                        auVar112._28_4_ = 0x219392ef;
                        auVar61 = vcmpps_avx(local_1220,auVar112,5);
                        auVar61 = vandps_avx(auVar61,ZEXT1632(auVar57));
                        auVar33._4_4_ = fVar91 * auVar61._4_4_;
                        auVar33._0_4_ = fVar83 * auVar61._0_4_;
                        auVar33._8_4_ = fVar92 * auVar61._8_4_;
                        auVar33._12_4_ = fVar93 * auVar61._12_4_;
                        auVar33._16_4_ = fVar94 * auVar61._16_4_;
                        auVar33._20_4_ = fVar95 * auVar61._20_4_;
                        auVar33._24_4_ = fVar97 * auVar61._24_4_;
                        auVar33._28_4_ = fVar98;
                        local_1340 = vminps_avx(auVar33,auVar122);
                        auVar34._4_4_ =
                             (fVar80 * auVar62._4_4_ + local_13c0._4_4_) * fVar96 * auVar61._4_4_;
                        auVar34._0_4_ =
                             (fVar68 * auVar62._0_4_ + local_13c0._0_4_) * fVar96 * auVar61._0_4_;
                        auVar34._8_4_ =
                             (fVar81 * auVar62._8_4_ + local_13c0._8_4_) * fVar96 * auVar61._8_4_;
                        auVar34._12_4_ =
                             (fVar82 * auVar62._12_4_ + local_13c0._12_4_) * fVar96 * auVar61._12_4_
                        ;
                        auVar34._16_4_ =
                             (auVar62._16_4_ * 0.0 + local_13c0._16_4_) * fVar96 * auVar61._16_4_;
                        auVar34._20_4_ =
                             (auVar62._20_4_ * 0.0 + local_13c0._20_4_) * fVar96 * auVar61._20_4_;
                        auVar34._24_4_ =
                             (auVar62._24_4_ * 0.0 + local_13c0._24_4_) * fVar96 * auVar61._24_4_;
                        auVar34._28_4_ = auVar61._28_4_;
                        local_1320 = vminps_avx(auVar34,auVar122);
                        auVar77._8_4_ = 0x7f800000;
                        auVar77._0_8_ = 0x7f8000007f800000;
                        auVar77._12_4_ = 0x7f800000;
                        auVar77._16_4_ = 0x7f800000;
                        auVar77._20_4_ = 0x7f800000;
                        auVar77._24_4_ = 0x7f800000;
                        auVar77._28_4_ = 0x7f800000;
                        auVar61 = vblendvps_avx(auVar77,local_15c0,local_1360);
                        auVar62 = vshufps_avx(auVar61,auVar61,0xb1);
                        auVar62 = vminps_avx(auVar61,auVar62);
                        auVar72 = vshufpd_avx(auVar62,auVar62,5);
                        auVar62 = vminps_avx(auVar62,auVar72);
                        auVar72 = vpermpd_avx2(auVar62,0x4e);
                        auVar62 = vminps_avx(auVar62,auVar72);
                        auVar62 = vcmpps_avx(auVar61,auVar62,0);
                        auVar72 = local_1360 & auVar62;
                        auVar61 = local_1360;
                        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar72 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar72 >> 0x7f,0) != '\0') ||
                              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar72 >> 0xbf,0) != '\0') ||
                            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar72[0x1f] < '\0') {
                          auVar61 = vandps_avx(auVar62,local_1360);
                        }
                        auVar62 = vpcmpeqd_avx2(auVar122,auVar122);
                        auVar130 = ZEXT3264(auVar62);
                        uVar38 = vmovmskps_avx(auVar61);
                        uVar42 = 0;
                        for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                          uVar42 = uVar42 + 1;
                        }
                        uVar48 = (ulong)uVar42;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar124 = *(undefined4 *)(local_1340 + uVar48 * 4);
                          uVar1 = *(undefined4 *)(local_1320 + uVar48 * 4);
                          fVar97 = local_12e0[uVar48];
                          fVar83 = local_12c0[uVar48];
                          fVar68 = local_12a0[uVar48];
                          *(float *)(local_15f8 + k * 4 + 0x100) = local_12e0[uVar48 - 8];
                          *(float *)(local_15f8 + k * 4 + 0x180) = fVar97;
                          *(float *)(local_15f8 + k * 4 + 0x1a0) = fVar83;
                          *(float *)(local_15f8 + k * 4 + 0x1c0) = fVar68;
                          *(undefined4 *)(local_15f8 + k * 4 + 0x1e0) = uVar124;
                          *(undefined4 *)(local_15f8 + k * 4 + 0x200) = uVar1;
                          *(uint *)(local_15f8 + k * 4 + 0x220) = local_1660._4_4_;
                          *(uint *)(local_15f8 + k * 4 + 0x240) = uStack_1478;
                          *(uint *)(local_15f8 + k * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(local_15f8 + k * 4 + 0x280) = context->user->instPrimID[0];
                        }
                        else {
                          local_1480 = CONCAT44(uStack_1478,uStack_1478);
                          local_1660._0_4_ = local_1660._4_4_;
                          uStack_1658._0_4_ = local_1660._4_4_;
                          uStack_1658._4_4_ = local_1660._4_4_;
                          uStack_1650._0_4_ = local_1660._4_4_;
                          uStack_1650._4_4_ = local_1660._4_4_;
                          uStack_1648._0_4_ = local_1660._4_4_;
                          uStack_1648._4_4_ = local_1660._4_4_;
                          auVar137 = ZEXT464(*(uint *)(local_15f8 + k * 4 + 0x100));
                          uStack_1474 = uStack_1478;
                          uStack_1470 = uStack_1478;
                          uStack_146c = uStack_1478;
                          uStack_1468 = uStack_1478;
                          uStack_1464 = uStack_1478;
                          local_1460 = local_1360;
                          while( true ) {
                            local_1060 = *(undefined4 *)(local_1340 + uVar48 * 4);
                            local_1040 = *(undefined4 *)(local_1320 + uVar48 * 4);
                            *(float *)(pRVar36 + k * 4 + 0x100) = local_12e0[uVar48 - 8];
                            local_10c0 = local_12e0[uVar48];
                            fVar97 = local_12c0[uVar48];
                            local_10a0._4_4_ = fVar97;
                            local_10a0._0_4_ = fVar97;
                            local_10a0._8_4_ = fVar97;
                            local_10a0._12_4_ = fVar97;
                            local_10a0._16_4_ = fVar97;
                            local_10a0._20_4_ = fVar97;
                            local_10a0._24_4_ = fVar97;
                            local_10a0._28_4_ = fVar97;
                            fVar97 = local_12a0[uVar48];
                            local_1080._4_4_ = fVar97;
                            local_1080._0_4_ = fVar97;
                            local_1080._8_4_ = fVar97;
                            local_1080._12_4_ = fVar97;
                            local_1080._16_4_ = fVar97;
                            local_1080._20_4_ = fVar97;
                            local_1080._24_4_ = fVar97;
                            local_1080._28_4_ = fVar97;
                            local_1590.context = context->user;
                            fStack_10bc = local_10c0;
                            fStack_10b8 = local_10c0;
                            fStack_10b4 = local_10c0;
                            fStack_10b0 = local_10c0;
                            fStack_10ac = local_10c0;
                            fStack_10a8 = local_10c0;
                            fStack_10a4 = local_10c0;
                            uStack_105c = local_1060;
                            uStack_1058 = local_1060;
                            uStack_1054 = local_1060;
                            uStack_1050 = local_1060;
                            uStack_104c = local_1060;
                            uStack_1048 = local_1060;
                            uStack_1044 = local_1060;
                            uStack_103c = local_1040;
                            uStack_1038 = local_1040;
                            uStack_1034 = local_1040;
                            uStack_1030 = local_1040;
                            uStack_102c = local_1040;
                            uStack_1028 = local_1040;
                            uStack_1024 = local_1040;
                            local_1020 = local_1660;
                            uStack_1018 = uStack_1658;
                            uStack_1010 = uStack_1650;
                            uStack_1008 = uStack_1648;
                            local_1000 = local_1480;
                            uStack_ff8 = CONCAT44(uStack_1474,uStack_1478);
                            uStack_ff0 = CONCAT44(uStack_146c,uStack_1470);
                            uStack_fe8 = CONCAT44(uStack_1464,uStack_1468);
                            uStack_fdc = (local_1590.context)->instID[0];
                            local_fe0 = uStack_fdc;
                            uStack_fd8 = uStack_fdc;
                            uStack_fd4 = uStack_fdc;
                            uStack_fd0 = uStack_fdc;
                            uStack_fcc = uStack_fdc;
                            uStack_fc8 = uStack_fdc;
                            uStack_fc4 = uStack_fdc;
                            uStack_fbc = (local_1590.context)->instPrimID[0];
                            local_fc0 = uStack_fbc;
                            uStack_fb8 = uStack_fbc;
                            uStack_fb4 = uStack_fbc;
                            uStack_fb0 = uStack_fbc;
                            uStack_fac = uStack_fbc;
                            uStack_fa8 = uStack_fbc;
                            uStack_fa4 = uStack_fbc;
                            local_1440 = local_1240;
                            local_1590.valid = (int *)local_1440;
                            local_1590.geometryUserPtr = pGVar6->userPtr;
                            local_1590.ray = (RTCRayN *)pRVar36;
                            local_1590.hit = (RTCHitN *)&local_10c0;
                            local_1590.N = 8;
                            if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              local_1680._0_16_ = auVar137._0_16_;
                              auVar61 = ZEXT1632(auVar130._0_16_);
                              (*pGVar6->intersectionFilterN)(&local_1590);
                              auVar137 = ZEXT1664(local_1680._0_16_);
                              auVar123 = ZEXT3264(local_15c0);
                              auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                              auVar130 = ZEXT3264(auVar61);
                            }
                            auVar62 = vpcmpeqd_avx2(local_1440,_DAT_01faff00);
                            auVar61 = auVar130._0_32_ & ~auVar62;
                            if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar61 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar61 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar61 >> 0x7f,0) == '\0') &&
                                  (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar61 >> 0xbf,0) == '\0') &&
                                (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar61[0x1f]) {
                              auVar62 = auVar62 ^ auVar130._0_32_;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                local_1680._0_16_ = auVar137._0_16_;
                                auVar61 = ZEXT1632(auVar130._0_16_);
                                (*p_Var11)(&local_1590);
                                auVar137 = ZEXT1664(local_1680._0_16_);
                                auVar123 = ZEXT3264(local_15c0);
                                auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                                auVar130 = ZEXT3264(auVar61);
                              }
                              auVar72 = vpcmpeqd_avx2(local_1440,_DAT_01faff00);
                              auVar62 = auVar72 ^ auVar130._0_32_;
                              auVar61 = auVar130._0_32_ & ~auVar72;
                              if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar61 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar61 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar61 >> 0x7f,0) != '\0')
                                    || (auVar61 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar61 >> 0xbf,0) != '\0')
                                  || (auVar61 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar61[0x1f] < '\0') {
                                auVar78._0_4_ = auVar72._0_4_ ^ auVar130._0_4_;
                                auVar78._4_4_ = auVar72._4_4_ ^ auVar130._4_4_;
                                auVar78._8_4_ = auVar72._8_4_ ^ auVar130._8_4_;
                                auVar78._12_4_ = auVar72._12_4_ ^ auVar130._12_4_;
                                auVar78._16_4_ = auVar72._16_4_ ^ auVar130._16_4_;
                                auVar78._20_4_ = auVar72._20_4_ ^ auVar130._20_4_;
                                auVar78._24_4_ = auVar72._24_4_ ^ auVar130._24_4_;
                                auVar78._28_4_ = auVar72._28_4_ ^ auVar130._28_4_;
                                auVar61 = vmaskmovps_avx(auVar78,*(undefined1 (*) [32])
                                                                  local_1590.hit);
                                *(undefined1 (*) [32])(local_1590.ray + 0x180) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar78,*(undefined1 (*) [32])
                                                                  (local_1590.hit + 0x20));
                                *(undefined1 (*) [32])(local_1590.ray + 0x1a0) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar78,*(undefined1 (*) [32])
                                                                  (local_1590.hit + 0x40));
                                *(undefined1 (*) [32])(local_1590.ray + 0x1c0) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar78,*(undefined1 (*) [32])
                                                                  (local_1590.hit + 0x60));
                                *(undefined1 (*) [32])(local_1590.ray + 0x1e0) = auVar61;
                                auVar61 = vmaskmovps_avx(auVar78,*(undefined1 (*) [32])
                                                                  (local_1590.hit + 0x80));
                                *(undefined1 (*) [32])(local_1590.ray + 0x200) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar78,*(undefined1 (*) [32])
                                                                   (local_1590.hit + 0xa0));
                                *(undefined1 (*) [32])(local_1590.ray + 0x220) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar78,*(undefined1 (*) [32])
                                                                   (local_1590.hit + 0xc0));
                                *(undefined1 (*) [32])(local_1590.ray + 0x240) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar78,*(undefined1 (*) [32])
                                                                   (local_1590.hit + 0xe0));
                                *(undefined1 (*) [32])(local_1590.ray + 0x260) = auVar61;
                                auVar61 = vpmaskmovd_avx2(auVar78,*(undefined1 (*) [32])
                                                                   (local_1590.hit + 0x100));
                                *(undefined1 (*) [32])(local_1590.ray + 0x280) = auVar61;
                              }
                            }
                            if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar62 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar62 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar62 >> 0x7f,0) == '\0') &&
                                  (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar62 >> 0xbf,0) == '\0') &&
                                (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar62[0x1f]) {
                              *(int *)(pRVar36 + k * 4 + 0x100) = auVar137._0_4_;
                            }
                            else {
                              auVar137 = ZEXT464(*(uint *)(pRVar36 + k * 4 + 0x100));
                            }
                            *(undefined4 *)(local_1460 + uVar48 * 4) = 0;
                            uVar124 = auVar137._0_4_;
                            auVar67._4_4_ = uVar124;
                            auVar67._0_4_ = uVar124;
                            auVar67._8_4_ = uVar124;
                            auVar67._12_4_ = uVar124;
                            auVar67._16_4_ = uVar124;
                            auVar67._20_4_ = uVar124;
                            auVar67._24_4_ = uVar124;
                            auVar67._28_4_ = uVar124;
                            auVar62 = vcmpps_avx(auVar123._0_32_,auVar67,2);
                            auVar61 = vandps_avx(auVar62,local_1460);
                            local_1460 = local_1460 & auVar62;
                            if ((((((((local_1460 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_1460 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_1460 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(local_1460 >> 0x7f,0) == '\0')
                                  && (local_1460 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && SUB321(local_1460 >> 0xbf,0) == '\0')
                                && (local_1460 & (undefined1  [32])0x100000000) ==
                                   (undefined1  [32])0x0) && -1 < local_1460[0x1f]) break;
                            auVar79._8_4_ = 0x7f800000;
                            auVar79._0_8_ = 0x7f8000007f800000;
                            auVar79._12_4_ = 0x7f800000;
                            auVar79._16_4_ = 0x7f800000;
                            auVar79._20_4_ = 0x7f800000;
                            auVar79._24_4_ = 0x7f800000;
                            auVar79._28_4_ = 0x7f800000;
                            auVar62 = vblendvps_avx(auVar79,auVar123._0_32_,auVar61);
                            auVar72 = vshufps_avx(auVar62,auVar62,0xb1);
                            auVar72 = vminps_avx(auVar62,auVar72);
                            auVar14 = vshufpd_avx(auVar72,auVar72,5);
                            auVar72 = vminps_avx(auVar72,auVar14);
                            auVar14 = vpermpd_avx2(auVar72,0x4e);
                            auVar72 = vminps_avx(auVar72,auVar14);
                            auVar72 = vcmpps_avx(auVar62,auVar72,0);
                            auVar14 = auVar61 & auVar72;
                            auVar62 = auVar61;
                            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar14 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar14 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar14 >> 0x7f,0) != '\0') ||
                                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar14 >> 0xbf,0) != '\0') ||
                                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar14[0x1f] < '\0') {
                              auVar62 = vandps_avx(auVar72,auVar61);
                            }
                            uVar38 = vmovmskps_avx(auVar62);
                            uVar42 = 0;
                            for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                              uVar42 = uVar42 + 1;
                            }
                            uVar48 = (ulong)uVar42;
                            local_1460 = auVar61;
                          }
                        }
                      }
                    }
                  }
                }
                auVar189 = ZEXT1664(local_14f0);
                uVar45 = local_1618;
                pauVar39 = local_15e8;
                uVar48 = local_16a0;
                uVar47 = local_1600;
                uVar49 = local_1608;
                uVar50 = local_1610;
                uVar53 = local_1620;
                ray = pRVar36;
                uVar54 = local_15f0;
                fVar95 = local_14b0;
                fVar98 = fStack_14ac;
                fVar96 = fStack_14a8;
                fVar155 = fStack_14a4;
                fVar159 = local_14c0;
                fVar162 = fStack_14bc;
                fVar163 = fStack_14b8;
                fVar164 = fStack_14b4;
                fVar167 = local_14d0;
                fVar174 = fStack_14cc;
                fVar81 = fStack_14c8;
                fVar82 = fStack_14c4;
                fVar147 = local_14e0;
                fVar152 = fStack_14dc;
                fVar153 = fStack_14d8;
                fVar154 = fStack_14d4;
              }
              local_15c8 = local_15c8 - 1 & local_15c8;
            } while (local_15c8 != 0);
          }
          local_1628 = local_1628 + 1;
        } while (local_1628 != local_1630);
      }
      uVar124 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar192 = ZEXT1664(CONCAT412(uVar124,CONCAT48(uVar124,CONCAT44(uVar124,uVar124))));
      auVar130 = ZEXT1664(local_1500);
      auVar137 = ZEXT1664(local_1510);
      auVar123 = ZEXT1664(local_1640);
      fVar97 = local_1520;
      fVar83 = fStack_151c;
      fVar68 = fStack_1518;
      fVar80 = fStack_1514;
      fVar91 = local_1530;
      fVar92 = fStack_152c;
      fVar93 = fStack_1528;
      fVar94 = fStack_1524;
    }
    if (pauVar39 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }